

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::ConcatenatingInputStream::BackUp(ConcatenatingInputStream *this,int count)

{
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  int local_14;
  ConcatenatingInputStream *pCStack_10;
  int count_local;
  ConcatenatingInputStream *this_local;
  
  local_14 = count;
  pCStack_10 = this;
  if (this->stream_count_ < 1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0x174);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t BackUp() after failed Next().");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  else {
    (*(*this->streams_)->_vptr_ZeroCopyInputStream[3])(*this->streams_,(ulong)(uint)count);
  }
  return;
}

Assistant:

void ConcatenatingInputStream::BackUp(int count) {
  if (stream_count_ > 0) {
    streams_[0]->BackUp(count);
  } else {
    GOOGLE_LOG(DFATAL) << "Can't BackUp() after failed Next().";
  }
}